

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiTableColumn::ImGuiTableColumn(ImGuiTableColumn *this)

{
  ImGuiTableColumn *this_local;
  
  ImRect::ImRect(&this->ClipRect);
  memset(this,0,0x68);
  this->WidthRequest = -1.0;
  this->StretchWeight = -1.0;
  this->NameOffset = -1;
  this->IndexWithinEnabledSet = -1;
  this->DisplayOrder = -1;
  this->NextEnabledColumn = -1;
  this->PrevEnabledColumn = -1;
  this->SortOrder = -1;
  this->field_0x65 = this->field_0x65 & 0xfc;
  this->DrawChannelUnfrozen = 0xff;
  this->DrawChannelFrozen = 0xff;
  this->DrawChannelCurrent = 0xff;
  return;
}

Assistant:

ImGuiTableColumn()
    {
        memset(this, 0, sizeof(*this));
        StretchWeight = WidthRequest = -1.0f;
        NameOffset = -1;
        DisplayOrder = IndexWithinEnabledSet = -1;
        PrevEnabledColumn = NextEnabledColumn = -1;
        SortOrder = -1;
        SortDirection = ImGuiSortDirection_None;
        DrawChannelCurrent = DrawChannelFrozen = DrawChannelUnfrozen = (ImU8)-1;
    }